

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordString *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  size_t __n;
  size_t __n_00;
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  string line;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __n = (option->super_OptionRecord).name._M_string_length;
  if ((__n != kOptionsFileString_abi_cxx11_._M_string_length) ||
     ((__n != 0 &&
      (iVar3 = bcmp((option->super_OptionRecord).name._M_dataplus._M_p,
                    kOptionsFileString_abi_cxx11_._M_dataplus._M_p,__n), iVar3 != 0)))) {
    if (report_only_deviations) {
      __n_00 = (option->default_value)._M_string_length;
      if (__n_00 == option->value->_M_string_length) {
        if (__n_00 == 0) {
          return;
        }
        iVar3 = bcmp((option->default_value)._M_dataplus._M_p,(option->value->_M_dataplus)._M_p,
                     __n_00);
        if (iVar3 == 0) {
          return;
        }
      }
    }
    if (file_type == kFull) {
      fprintf((FILE *)file,"\n# %s\n",(option->super_OptionRecord).description._M_dataplus._M_p);
      highsBoolToString_abi_cxx11_(&local_b0,(option->super_OptionRecord).advanced,2);
      fprintf((FILE *)file,"# [type: string, advanced: %s, default: \"%s\"]\n",
              local_b0._M_dataplus._M_p,(option->default_value)._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      fprintf((FILE *)file,"%s = %s\n",(option->super_OptionRecord).name._M_dataplus._M_p,
              (option->value->_M_dataplus)._M_p);
    }
    else {
      if (file_type == kMd) {
        pcVar1 = (option->super_OptionRecord).name._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1 + __n);
        highsInsertMdEscapes(&local_b0,&local_70);
        _Var2._M_p = local_b0._M_dataplus._M_p;
        pcVar1 = (option->super_OptionRecord).description._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,
                   pcVar1 + (option->super_OptionRecord).description._M_string_length);
        highsInsertMdEscapes(&local_50,&local_90);
        fprintf((FILE *)file,"## %s\n- %s\n- Type: string\n- Default: \"%s\"\n\n",_Var2._M_p,
                local_50._M_dataplus._M_p,(option->default_value)._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        local_b0._M_dataplus._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return;
        }
      }
      else {
        highsFormatToString_abi_cxx11_
                  (&local_b0,"Set option %s to \"%s\"\n",
                   (option->super_OptionRecord).name._M_dataplus._M_p,
                   (option->value->_M_dataplus)._M_p);
        if (_stdout == file) {
          highsLogUser(log_options,kInfo,"%s");
        }
        else {
          fputs(local_b0._M_dataplus._M_p,(FILE *)file);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
          return;
        }
      }
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordString& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  // Don't report for the options file if writing to an options file
  // Don't report options that can only be passed via the command line
  if (option.name == kOptionsFileString) return;
  // ToDo: are there others?

  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(file, "## %s\n- %s\n- Type: string\n- Default: \"%s\"\n\n",
              highsInsertMdEscapes(option.name).c_str(),
              highsInsertMdEscapes(option.description).c_str(),
              option.default_value.c_str());
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(file, "# [type: string, advanced: %s, default: \"%s\"]\n",
              highsBoolToString(option.advanced).c_str(),
              option.default_value.c_str());
      fprintf(file, "%s = %s\n", option.name.c_str(), (*option.value).c_str());
    } else {
      std::string line =
          highsFormatToString("Set option %s to \"%s\"\n", option.name.c_str(),
                              (*option.value).c_str());
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}